

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_uint64(basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            uint64_t val,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  back_insert_iterator<jsoncons::binary_stream_sink> d_first;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_00;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_01;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_02;
  byte bVar1;
  short sVar2;
  undefined2 uVar3;
  int iVar4;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *pbVar5;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_RSI;
  binary_stream_sink *in_stack_ffffffffffffff68;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
  *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  uint8_t ch;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *pbVar6;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  uchar val_01;
  short val_00;
  undefined6 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff96;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *val_02;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  
  ch = (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  bVar1 = std::numeric_limits<unsigned_char>::max();
  val_00 = (short)((ulong)in_stack_ffffffffffffff88 >> 0x30);
  if ((basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)(ulong)bVar1 <
      in_RSI) {
    val_02 = in_RSI;
    sVar2 = std::numeric_limits<short>::max();
    if ((basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)(long)sVar2 <
        val_02) {
      pbVar6 = in_RSI;
      iVar4 = std::numeric_limits<int>::max();
      if ((basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)(long)iVar4 <
          pbVar6) {
        pbVar6 = in_RSI;
        pbVar5 = (basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 std::numeric_limits<long>::max();
        if (pbVar6 <= pbVar5) {
          binary_stream_sink::push_back
                    ((binary_stream_sink *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (uint8_t)((ulong)pbVar6 >> 0x38));
          std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff68);
          d_first_02.container._7_1_ = in_stack_ffffffffffffffa7;
          d_first_02.container._0_7_ = in_stack_ffffffffffffffa0;
          binary::
          native_to_big<long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                    ((long)val_02,d_first_02);
          in_stack_ffffffffffffff70 = in_RSI;
        }
      }
      else {
        binary_stream_sink::push_back
                  ((binary_stream_sink *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),ch);
        iVar4 = (int)((ulong)val_02 >> 0x20);
        std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff68);
        d_first_01.container._7_1_ = in_stack_ffffffffffffffa7;
        d_first_01.container._0_7_ = in_stack_ffffffffffffffa0;
        binary::
        native_to_big<int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (iVar4,d_first_01);
      }
    }
    else {
      binary_stream_sink::push_back
                ((binary_stream_sink *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                 ,ch);
      uVar3 = SUB82(in_RSI,0);
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff68);
      d_first_00.container._6_2_ = uVar3;
      d_first_00.container._0_6_ = in_stack_ffffffffffffff90;
      binary::
      native_to_big<short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (val_00,d_first_00);
    }
  }
  else {
    binary_stream_sink::push_back
              ((binary_stream_sink *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               ch);
    val_01 = (uchar)((ulong)in_stack_ffffffffffffff88 >> 0x38);
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff68);
    d_first.container._6_2_ = in_stack_ffffffffffffff96;
    d_first.container._0_6_ = in_stack_ffffffffffffff90;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val_01,d_first);
  }
  end_value(in_stack_ffffffffffffff70);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t val, 
                      semantic_tag, 
                      const ser_context&,
                      std::error_code&) override
    {
        if (val <= (std::numeric_limits<uint8_t>::max)())
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::uint8_type);
            binary::native_to_big(static_cast<uint8_t>(val),std::back_inserter(sink_));
        }
        else if (val <= static_cast<uint64_t>((std::numeric_limits<int16_t>::max)()))
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::int16_type);
            binary::native_to_big(static_cast<int16_t>(val),std::back_inserter(sink_));
        }
        else if (val <= static_cast<uint64_t>((std::numeric_limits<int32_t>::max)()))
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::int32_type);
            binary::native_to_big(static_cast<int32_t>(val),std::back_inserter(sink_));
        }
        else if (val <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
        {
            sink_.push_back(jsoncons::ubjson::ubjson_type::int64_type);
            binary::native_to_big(static_cast<int64_t>(val),std::back_inserter(sink_));
        }
        end_value();
        JSONCONS_VISITOR_RETURN;
    }